

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QCalendarBackend::dateTimeToString
          (QString *__return_storage_ptr__,QCalendarBackend *this,QStringView format,
          QDateTime *datetime,QDate dateOnly,QTime timeOnly,QLocale *locale)

{
  QChar fillChar;
  QLocaleData *pQVar1;
  bool bVar2;
  Data *pDVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  CutResult CVar11;
  int iVar12;
  char32_t cVar13;
  int iVar14;
  time_t tVar15;
  uint extraout_var;
  storage_type_conflict *psVar16;
  storage_type_conflict *psVar17;
  int extraout_EDX;
  qsizetype qVar18;
  QArrayData *pQVar19;
  QArrayData *pQVar20;
  QCalendarBackend *__timer;
  QLocale QVar21;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView str;
  QStringView needle;
  QStringView haystack;
  QDateTime when;
  qsizetype i_1;
  qsizetype i;
  anon_class_8_1_5fb9ff98 tzAbbr;
  int local_f4;
  undefined8 local_e8;
  ulong local_d8;
  qint64 local_c8;
  Data local_b0;
  QString local_a8;
  QArrayData *local_90;
  QString local_88;
  QTime local_64;
  QLocale local_60;
  QString local_58;
  long local_38;
  
  psVar16 = format.m_data;
  qVar18 = format.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_64.mds = -1;
  __timer = this;
  bVar8 = QDateTime::isValid(datetime);
  if (bVar8) {
    dateOnly = QDateTime::date(datetime);
    tVar15 = QDateTime::time(datetime,(time_t *)__timer);
    local_64.mds = (int)tVar15;
LAB_0030f9cd:
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
    iVar10 = (*this->_vptr_QCalendarBackend[0x11])(this,dateOnly.jd);
    local_e8 = CONCAT44(extraout_var,iVar10);
    local_d8 = (ulong)extraout_var;
    if (local_d8 == 0x80000000) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_0031070b;
    }
    bVar8 = !bVar8;
    bVar2 = true;
    local_f4 = extraout_EDX;
    local_c8 = dateOnly.jd;
  }
  else {
    if (dateOnly.jd + 0xb69eeff91fU < 0x16d3e147974) goto LAB_0030f9cd;
    bVar8 = QTime::isValid(&timeOnly);
    if (!bVar8) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      goto LAB_0031070b;
    }
    local_64.mds = timeOnly.mds;
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
    bVar2 = false;
    local_c8 = -0x8000000000000000;
    bVar8 = false;
    local_f4 = 0;
    local_d8 = 0;
    local_e8 = 0;
  }
  local_90 = (QArrayData *)0x0;
  if (0 < qVar18) {
    do {
      pQVar5 = local_90;
      fillChar.ucs = psVar16[(long)local_90];
      if (fillChar.ucs == L'\'') {
        qt_readEscapedFormatString(&local_58,format,(qsizetype *)&local_90);
        QString::append(&local_88,&local_58);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        local_a8.d.d = (Data *)0xffffffffffffffff;
        local_58.d.d = (Data *)local_90;
        CVar11 = QtPrivate::QContainerImplHelper::mid
                           (qVar18,(qsizetype *)&local_58,(qsizetype *)&local_a8);
        psVar17 = psVar16 + (long)local_58.d.d;
        if (CVar11 == Null) {
          psVar17 = (storage_type_conflict *)0x0;
        }
        pQVar20 = (QArrayData *)0x0;
        if ((&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0 && CVar11 != Null) &&
           (pQVar19 = (QArrayData *)0x1, pQVar20 = pQVar19, 1 < (long)local_a8.d.d)) {
          do {
            pQVar20 = pQVar19;
            if (psVar17[(long)pQVar19] != psVar16[(long)local_58.d.d]) break;
            pQVar19 = (QArrayData *)
                      ((long)&(pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1);
            pQVar20 = &(local_a8.d.d)->super_QArrayData;
          } while (&(local_a8.d.d)->super_QArrayData != pQVar19);
        }
        iVar10 = (int)pQVar20;
        if (bVar2) {
          if (fillChar.ucs == L'M') {
            iVar14 = 4;
            if (iVar10 < 4) {
              iVar14 = iVar10;
            }
            if (2 < iVar10) {
              (*this->_vptr_QCalendarBackend[0x14])
                        (&local_58,this,locale,local_d8,local_e8,(ulong)(iVar10 == 3));
              QString::append(&local_88,&local_58);
              goto LAB_00310526;
            }
            iVar12 = (int)local_d8;
LAB_0030fda5:
            dateTimeToString::anon_class_16_2_4001139c::operator()
                      ((anon_class_16_2_4001139c *)((locale->d).d.ptr)->m_data,(int)&local_88,iVar12
                      );
            iVar14 = iVar10;
          }
          else if (fillChar.ucs == L'd') {
            iVar14 = 4;
            if (iVar10 < 4) {
              iVar14 = iVar10;
            }
            iVar12 = local_f4;
            if (iVar10 < 3) goto LAB_0030fda5;
            iVar12 = (*this->_vptr_QCalendarBackend[0x12])(this,local_c8);
            QCalendar::QCalendar((QCalendar *)&local_a8);
            QCalendar::weekDayName
                      (&local_58,(QCalendar *)&local_a8,locale,iVar12,(uint)(iVar10 == 3));
            QString::append(&local_88,&local_58);
LAB_00310526:
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          else {
            if (fillChar.ucs != L'y') goto LAB_0030fc8e;
            if (iVar10 < 4) {
              if (iVar10 < 2) {
                QString::append(&local_88,(QChar)0x79);
                iVar14 = 1;
              }
              else {
                QLocaleData::longLongToString
                          (&local_58,((locale->d).d.ptr)->m_data,(long)((int)local_e8 % 100),-1,10,2
                           ,2);
                QString::append(&local_88,&local_58);
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                  }
                }
                iVar14 = 2;
              }
            }
            else {
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        ((anon_class_16_2_4001139c *)((locale->d).d.ptr)->m_data,(int)&local_88,
                         (int)local_e8);
              iVar14 = 4;
            }
          }
        }
        else {
LAB_0030fc8e:
          if (bVar8) {
LAB_0030fc95:
            QString::resize(&local_88,iVar10 + local_88.d.size,fillChar);
            iVar14 = iVar10;
          }
          else if ((ushort)fillChar.ucs < 0x6d) {
            if ((ushort)fillChar.ucs < 0x61) {
              if (fillChar.ucs == L'A') {
LAB_0031003a:
                local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                iVar10 = QTime::hour(&local_64);
                if (iVar10 < 0xc) {
                  QLocale::amText(&local_58,locale);
                }
                else {
                  QLocale::pmText(&local_58,locale);
                }
                local_a8.d.d = (Data *)((long)&(pQVar5->ref_)._q_value.super___atomic_base<int>._M_i
                                       + 1);
                local_60.d.d.ptr =
                     (QSharedDataPointer<QLocalePrivate>)
                     (totally_ordered_wrapper<QLocalePrivate_*>)0xffffffffffffffff;
                CVar11 = QtPrivate::QContainerImplHelper::mid
                                   (qVar18,(qsizetype *)&local_a8,(qsizetype *)&local_60);
                if (CVar11 == Null) {
                  QVar21.d.d.ptr =
                       (QSharedDataPointer<QLocalePrivate>)
                       (totally_ordered_wrapper<QLocalePrivate_*>)0x0;
                  psVar17 = (storage_type_conflict *)0x0;
                }
                else {
                  psVar17 = psVar16 + (long)local_a8.d.d;
                  QVar21.d.d.ptr = local_60.d.d.ptr;
                }
                local_a8.d.d = (Data *)CONCAT62(local_a8.d.d._2_6_,0x70);
                needle.m_data = (storage_type_conflict *)&local_a8;
                needle.m_size = 1;
                haystack.m_data = psVar17;
                haystack.m_size = (qsizetype)QVar21.d.d.ptr;
                bVar9 = QtPrivate::startsWith(haystack,needle,CaseInsensitive);
                if (bVar9) {
                  iVar14 = 2;
                  if (fillChar.ucs == L'a') {
                    iVar10 = 2;
                    if (psVar16[(long)((long)&(pQVar5->ref_)._q_value.super___atomic_base<int>._M_i
                                      + 1)] == L'p') {
LAB_003104ad:
                      iVar14 = iVar10;
                      QString::toLower_helper(&local_a8,&local_58);
                      goto LAB_003104bf;
                    }
                  }
                  else if (fillChar.ucs == L'A') {
                    iVar14 = 2;
                    iVar10 = 2;
                    if (psVar16[(long)((long)&(pQVar5->ref_)._q_value.super___atomic_base<int>._M_i
                                      + 1)] == L'P') goto LAB_0031047f;
                  }
                }
                else {
                  iVar14 = 1;
                  iVar10 = 1;
                  if (fillChar.ucs == L'A') {
LAB_0031047f:
                    iVar14 = iVar10;
                    QString::toUpper_helper(&local_a8,&local_58);
LAB_003104bf:
                    pcVar6 = local_58.d.ptr;
                    pDVar7 = local_58.d.d;
                    qVar4 = local_a8.d.size;
                    pDVar3 = local_a8.d.d;
                    local_a8.d.d = local_58.d.d;
                    local_58.d.d = pDVar3;
                    local_58.d.ptr = local_a8.d.ptr;
                    local_a8.d.ptr = pcVar6;
                    local_a8.d.size = local_58.d.size;
                    local_58.d.size = qVar4;
                    if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                           -1;
                      UNLOCK();
                      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                          0) {
                        QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  else if (fillChar.ucs == L'a') goto LAB_003104ad;
                }
                QString::append(&local_88,&local_58);
                goto LAB_00310526;
              }
              if (fillChar.ucs != L'H') goto LAB_0030fc95;
              iVar12 = QTime::hour(&local_64);
              iVar14 = 2;
              if (iVar10 < 2) {
                iVar14 = iVar10;
              }
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        ((anon_class_16_2_4001139c *)((locale->d).d.ptr)->m_data,(int)&local_88,
                         iVar12);
            }
            else {
              if (fillChar.ucs == L'a') goto LAB_0031003a;
              if (fillChar.ucs != L'h') goto LAB_0030fc95;
              iVar14 = 2;
              if (iVar10 < 2) {
                iVar14 = iVar10;
              }
              iVar10 = QTime::hour(&local_64);
              local_a8.d.d = (Data *)0x0;
              do {
                pDVar3 = local_a8.d.d;
                if ((uint)(ushort)psVar16[(long)local_a8.d.d] == L'\'') {
                  qt_readEscapedFormatString(&local_58,format,(qsizetype *)&local_a8);
                  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                else {
                  cVar13 = QChar::toLower((uint)(ushort)psVar16[(long)local_a8.d.d]);
                  if ((short)cVar13 == 0x61) {
                    if (iVar10 < 0xd) {
                      if (iVar10 == 0) {
                        iVar10 = 0xc;
                      }
                    }
                    else {
                      iVar10 = iVar10 + -0xc;
                    }
                    break;
                  }
                  local_a8.d.d = (Data *)((long)&(pDVar3->super_QArrayData).ref_._q_value.
                                                 super___atomic_base<int>._M_i + 1);
                }
              } while ((long)local_a8.d.d < qVar18);
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        ((anon_class_16_2_4001139c *)((locale->d).d.ptr)->m_data,(int)&local_88,
                         iVar10);
            }
          }
          else if ((ushort)fillChar.ucs < 0x74) {
            if (fillChar.ucs == L'm') {
              iVar12 = QTime::minute(&local_64);
              iVar14 = 2;
              if (iVar10 < 2) {
                iVar14 = iVar10;
              }
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        ((anon_class_16_2_4001139c *)((locale->d).d.ptr)->m_data,(int)&local_88,
                         iVar12);
            }
            else {
              if (fillChar.ucs != L's') goto LAB_0030fc95;
              iVar12 = QTime::second(&local_64);
              iVar14 = 2;
              if (iVar10 < 2) {
                iVar14 = iVar10;
              }
              dateTimeToString::anon_class_16_2_4001139c::operator()
                        ((anon_class_16_2_4001139c *)((locale->d).d.ptr)->m_data,(int)&local_88,
                         iVar12);
            }
          }
          else if (fillChar.ucs == L't') {
            local_60.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
            QLocale::QLocale(&local_60,locale);
            iVar14 = 4;
            if (iVar10 < 4) {
              iVar14 = iVar10;
            }
            local_b0.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
            if (bVar2) {
              QDateTime::QDateTime((QDateTime *)&local_b0.data,datetime);
            }
            else {
              QDateTime::currentDateTime();
            }
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = (char16_t *)0x0;
            local_58.d.size = 0;
            if (iVar14 - 2U < 2) {
              dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                        (&local_a8,(anon_class_8_1_5fb9ff98 *)&local_60,(QDateTime *)&local_b0.data,
                         Offset);
              pcVar6 = local_58.d.ptr;
              pDVar7 = local_58.d.d;
              qVar4 = local_a8.d.size;
              pDVar3 = local_a8.d.d;
              local_a8.d.d = local_58.d.d;
              local_58.d.d = pDVar3;
              local_58.d.ptr = local_a8.d.ptr;
              local_a8.d.ptr = pcVar6;
              local_a8.d.size = local_58.d.size;
              local_58.d.size = qVar4;
              if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                }
              }
              if (iVar10 == 2) {
                QString::remove(&local_58,(char *)0x3a);
              }
            }
            else if (iVar14 == 4) {
              dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                        (&local_a8,(anon_class_8_1_5fb9ff98 *)&local_60,(QDateTime *)&local_b0.data,
                         Long);
              pcVar6 = local_58.d.ptr;
              pDVar7 = local_58.d.d;
              qVar4 = local_a8.d.size;
              pDVar3 = local_a8.d.d;
              local_a8.d.d = local_58.d.d;
              local_58.d.d = pDVar3;
              local_58.d.ptr = local_a8.d.ptr;
              local_a8.d.ptr = pcVar6;
              local_a8.d.size = local_58.d.size;
              local_58.d.size = qVar4;
              if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                }
              }
            }
            else {
              dateTimeToString::anon_class_8_1_5fb9ff98::operator()
                        (&local_a8,(anon_class_8_1_5fb9ff98 *)&local_60,(QDateTime *)&local_b0.data,
                         Short);
              pcVar6 = local_58.d.ptr;
              pDVar7 = local_58.d.d;
              qVar4 = local_a8.d.size;
              pDVar3 = local_a8.d.d;
              local_a8.d.d = local_58.d.d;
              local_58.d.d = pDVar3;
              local_58.d.ptr = local_a8.d.ptr;
              local_a8.d.ptr = pcVar6;
              local_a8.d.size = local_58.d.size;
              local_58.d.size = qVar4;
              if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                }
              }
              s.m_data = "UTC";
              s.m_size = 3;
              bVar9 = QString::startsWith(&local_58,s,CaseSensitive);
              if ((bVar9) && ((undefined1 *)local_58.d.size == (undefined1 *)0x6)) {
                str.m_data = ":00";
                str.m_size = 3;
                QString::append(&local_58,str);
              }
            }
            if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
              QString::append(&local_88,&local_58);
            }
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            QDateTime::~QDateTime((QDateTime *)&local_b0.data);
            QLocale::~QLocale(&local_60);
          }
          else {
            if (fillChar.ucs != L'z') goto LAB_0030fc95;
            iVar14 = QTime::msec(&local_64);
            QLocaleData::longLongToString
                      (&local_58,((locale->d).d.ptr)->m_data,(long)iVar14,-1,10,3,2);
            QString::append(&local_88,&local_58);
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            iVar14 = 3;
            if (iVar10 < 3) {
              pQVar1 = ((locale->d).d.ptr)->m_data;
              localeString(&local_58,pQVar1,ZeroDigit,
                           (DataRange)
                           ((ulong)pQVar1->m_zero_size << 0x20 | (ulong)pQVar1->m_zero_idx));
              bVar9 = QString::endsWith(&local_88,&local_58,CaseSensitive);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (bVar9) {
                QString::chop(&local_88,1);
              }
              pQVar1 = ((locale->d).d.ptr)->m_data;
              localeString(&local_58,pQVar1,ZeroDigit,
                           (DataRange)
                           ((ulong)pQVar1->m_zero_size << 0x20 | (ulong)pQVar1->m_zero_idx));
              bVar9 = QString::endsWith(&local_88,&local_58,CaseSensitive);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              iVar14 = iVar10;
              if (bVar9) {
                QString::chop(&local_88,1);
              }
            }
          }
        }
        local_90 = (QArrayData *)
                   ((long)&(local_90->ref_)._q_value.super___atomic_base<int>._M_i + (long)iVar14);
      }
    } while ((long)local_90 < qVar18);
  }
  qVar18 = local_88.d.size;
  pcVar6 = local_88.d.ptr;
  (__return_storage_ptr__->d).d = local_88.d.d;
  local_88.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).ptr = pcVar6;
  local_88.d.size = 0;
  (__return_storage_ptr__->d).size = qVar18;
LAB_0031070b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QCalendarBackend::dateTimeToString(QStringView format, const QDateTime &datetime,
                                           QDate dateOnly, QTime timeOnly,
                                           const QLocale &locale) const
{
    QDate date;
    QTime time;
    bool formatDate = false;
    bool formatTime = false;
    if (datetime.isValid()) {
        date = datetime.date();
        time = datetime.time();
        formatDate = true;
        formatTime = true;
    } else if (dateOnly.isValid()) {
        date = dateOnly;
        formatDate = true;
    } else if (timeOnly.isValid()) {
        time = timeOnly;
        formatTime = true;
    } else {
        return QString();
    }

    QString result;
    int year = 0, month = 0, day = 0;
    if (formatDate) {
        const auto parts = julianDayToDate(date.toJulianDay());
        if (!parts.isValid())
            return QString();
        year = parts.year;
        month = parts.month;
        day = parts.day;
    }

    auto appendToResult = [&](int t, int repeat) {
        auto data = locale.d->m_data;
        if (repeat > 1)
            result.append(data->longLongToString(t, -1, 10, repeat, QLocaleData::ZeroPadded));
        else
            result.append(data->longLongToString(t));
    };

    auto formatType = [](int repeat) {
        return repeat == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    };

    qsizetype i = 0;
    while (i < format.size()) {
        if (format.at(i).unicode() == '\'') {
            result.append(qt_readEscapedFormatString(format, &i));
            continue;
        }

        const QChar c = format.at(i);
        qsizetype rep = qt_repeatCount(format.mid(i));
        Q_ASSERT(rep < std::numeric_limits<int>::max());
        int repeat = int(rep);
        bool used = false;
        if (formatDate) {
            switch (c.unicode()) {
            case 'y':
                used = true;
                if (repeat >= 4)
                    repeat = 4;
                else if (repeat >= 2)
                    repeat = 2;

                switch (repeat) {
                case 4:
                    appendToResult(year, (year < 0) ? 5 : 4);
                    break;
                case 2:
                    appendToResult(year % 100, 2);
                    break;
                default:
                    repeat = 1;
                    result.append(c);
                    break;
                }
                break;

            case 'M':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(month, repeat);
                else
                    result.append(monthName(locale, month, year, formatType(repeat)));
                break;

            case 'd':
                used = true;
                repeat = qMin(repeat, 4);
                if (repeat <= 2)
                    appendToResult(day, repeat);
                else
                    result.append(
                            locale.dayName(dayOfWeek(date.toJulianDay()), formatType(repeat)));
                break;

            default:
                break;
            }
        }
        if (!used && formatTime) {
            switch (c.unicode()) {
            case 'h': {
                used = true;
                repeat = qMin(repeat, 2);
                int hour = time.hour();
                if (timeFormatContainsAP(format)) {
                    if (hour > 12)
                        hour -= 12;
                    else if (hour == 0)
                        hour = 12;
                }
                appendToResult(hour, repeat);
                break;
            }
            case 'H':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.hour(), repeat);
                break;

            case 'm':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.minute(), repeat);
                break;

            case 's':
                used = true;
                repeat = qMin(repeat, 2);
                appendToResult(time.second(), repeat);
                break;

            case 'A':
            case 'a': {
                QString text = time.hour() < 12 ? locale.amText() : locale.pmText();
                used = true;
                repeat = 1;
                if (format.mid(i + 1).startsWith(u'p', Qt::CaseInsensitive))
                    ++repeat;
                if (c.unicode() == 'A' && (repeat == 1 || format.at(i + 1).unicode() == 'P'))
                    text = std::move(text).toUpper();
                else if (c.unicode() == 'a' && (repeat == 1 || format.at(i + 1).unicode() == 'p'))
                    text = std::move(text).toLower();
                // else 'Ap' or 'aP' => use CLDR text verbatim, preserving case
                result.append(text);
                break;
            }

            case 'z':
                used = true;
                repeat = qMin(repeat, 3);

                // note: the millisecond component is treated like the decimal part of the seconds
                // so ms == 2 is always printed as "002", but ms == 200 can be either "2" or "200"
                appendToResult(time.msec(), 3);
                if (repeat != 3) {
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                    if (result.endsWith(locale.zeroDigit()))
                        result.chop(1);
                }
                break;

            case 't': {
                enum AbbrType { Long, Offset, Short };
                const auto tzAbbr = [locale](const QDateTime &when, AbbrType type) {
                    QString text;
                    if (type == Offset) {
                        text = QtTimeZoneLocale::zoneOffsetFormat(locale, locale.d->m_index,
                                                                  QLocale::ShortFormat,
                                                                  when, when.offsetFromUtc());
                        // When using timezone_locale data, this should always succeed:
                        if (!text.isEmpty())
                            return text;
                    }
#if QT_CONFIG(timezone)
                    if (type != Short || locale != QLocale::system()) {
                        QTimeZone::NameType mode =
                            type == Short ? QTimeZone::ShortName
                            : type == Long ? QTimeZone::LongName : QTimeZone::OffsetName;
                        text = when.timeRepresentation().displayName(when, mode, locale);
                        if (!text.isEmpty())
                            return text;
                        // else fall back to an unlocalized one if we can manage it:
                    } // else: prefer QDateTime's abbreviation, for backwards-compatibility.
#endif // else, make do with non-localized abbreviation:
                    // Absent timezone_locale data, Offset might still reach here:
                    if (type == Offset) // Our prior failure might not have tried this:
                        text = when.toOffsetFromUtc(when.offsetFromUtc()).timeZoneAbbreviation();
                    if (text.isEmpty()) // Notably including type != Offset
                        text = when.timeZoneAbbreviation();
                    return type == Offset ? offsetFromAbbreviation(std::move(text)) : text;
                };

                used = true;
                repeat = qMin(repeat, 4);
                // If we don't have a date-time, use the current system time:
                const QDateTime when = formatDate ? datetime : QDateTime::currentDateTime();
                QString text;
                switch (repeat) {
                case 4:
                    text = tzAbbr(when, Long);
                    break;
                case 3: // ±hh:mm
                case 2: // ±hhmm (we'll remove the ':' at the end)
                    text = tzAbbr(when, Offset);
                    if (repeat == 2)
                        text.remove(u':');
                    break;
                default:
                    text = tzAbbr(when, Short);
                    // UTC-offset zones only include minutes if non-zero.
                    if (text.startsWith("UTC"_L1) && text.size() == 6)
                        text += ":00"_L1;
                    break;
                }
                if (!text.isEmpty())
                    result.append(text);
                break;
            }

            default:
                break;
            }
        }
        if (!used)
            result.resize(result.size() + repeat, c);
        i += repeat;
    }

    return result;
}